

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_prefix(FuncState *fs,UnOpr op,expdesc *e)

{
  int iVar1;
  OpCode op_00;
  int iVar2;
  expdesc e2;
  
  e2.t = -1;
  e2.f = -1;
  e2.k = VKNUM;
  e2.u.nval = 0.0;
  if (op == OPR_LEN) {
    luaK_exp2anyreg(fs,e);
    op_00 = OP_LEN;
  }
  else {
    if (op == OPR_NOT) {
      luaK_dischargevars(fs,e);
      switch(e->k) {
      case VNIL:
      case VFALSE:
        e->k = VTRUE;
        break;
      case VTRUE:
      case VK:
      case VKNUM:
        e->k = VFALSE;
        break;
      case VJMP:
        invertjump(fs,e);
        break;
      case VRELOCABLE:
      case VNONRELOC:
        discharge2anyreg(fs,e);
        freeexp(fs,e);
        iVar2 = luaK_codeABC(fs,OP_NOT,0,(e->u).s.info,0);
        (e->u).s.info = iVar2;
        e->k = VRELOCABLE;
      }
      iVar2 = e->t;
      iVar1 = e->f;
      e->f = iVar2;
      e->t = iVar1;
      removevalues(fs,iVar2);
      removevalues(fs,e->t);
      return;
    }
    if (op != OPR_MINUS) {
      return;
    }
    iVar2 = isnumeral(e);
    if (iVar2 == 0) {
      luaK_exp2anyreg(fs,e);
    }
    op_00 = OP_UNM;
  }
  codearith(fs,op_00,e,&e2);
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr op, expdesc *e) {
  expdesc e2;
  e2.t = e2.f = NO_JUMP; e2.k = VKNUM; e2.u.nval = 0;
  switch (op) {
    case OPR_MINUS: {
      if (!isnumeral(e))
        luaK_exp2anyreg(fs, e);  /* cannot operate on non-numeric constants */
      codearith(fs, OP_UNM, e, &e2);
      break;
    }
    case OPR_NOT: codenot(fs, e); break;
    case OPR_LEN: {
      luaK_exp2anyreg(fs, e);  /* cannot operate on constants */
      codearith(fs, OP_LEN, e, &e2);
      break;
    }
    default: lua_assert(0);
  }
}